

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_array_suite.cpp
# Opt level: O2

void api_suite::api_contains(void)

{
  bool bVar1;
  key_type local_5c;
  map_array<int,_int,_4UL,_std::less<int>_> array;
  
  array.super_map_view<int,_int,_4UL,_std::less<int>_>.super_span<vista::pair<int,_int>,_4UL>.member
  .tail = (pointer)&array.super_map_view<int,_int,_4UL,_std::less<int>_>;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[2].first = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[2].second = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[3].first = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[3].second = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[0].first = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[0].second = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[1].first = 0;
  array.super_array<vista::pair<int,_int>,_4UL>._M_elems[1].second = 0;
  array.super_map_view<int,_int,_4UL,_std::less<int>_>.super_span<vista::pair<int,_int>,_4UL>.member
  .head = (pointer)&array;
  array.super_map_view<int,_int,_4UL,_std::less<int>_>.member.tail = (iterator)&array;
  vista::map_view<int,_int,_4UL,_std::less<int>_>::insert
            ((map_view<int,_int,_4UL,_std::less<int>_> *)
             array.super_map_view<int,_int,_4UL,_std::less<int>_>.
             super_span<vista::pair<int,_int>,_4UL>.member.tail,(value_type)0x10000000b);
  local_5c = 10;
  bVar1 = vista::map_array<int,_int,_4UL,_std::less<int>_>::contains(&array,&local_5c);
  boost::detail::test_impl
            ("!array.contains(10)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x7b,"void api_suite::api_contains()",!bVar1);
  local_5c = 0xb;
  bVar1 = vista::map_array<int,_int,_4UL,_std::less<int>_>::contains(&array,&local_5c);
  boost::detail::test_impl
            ("array.contains(11)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x7c,"void api_suite::api_contains()",bVar1);
  local_5c = 0xc;
  bVar1 = vista::map_array<int,_int,_4UL,_std::less<int>_>::contains(&array,&local_5c);
  boost::detail::test_impl
            ("!array.contains(12)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x7d,"void api_suite::api_contains()",!bVar1);
  return;
}

Assistant:

void api_ctor_default()
{
    map_array<int, int, 4> array;
    BOOST_TEST_EQ(array.size(), 0);
    BOOST_TEST_EQ(array.capacity(), 4);
}